

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O2

void compute_response_layer_switch_Dyy_unconditional(response_layer *layer,integral_image *iimage)

{
  uint uVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  long lVar4;
  integral_image *piVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined8 uStack_140;
  long local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  uint local_114;
  integral_image *local_110;
  float *local_108;
  bool *local_100;
  int local_f4;
  ulong local_f0;
  long local_e8;
  float *local_e0;
  undefined1 *local_d8;
  ulong local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  bool *local_a8;
  bool *local_a0;
  float *local_98;
  float *local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  long local_70;
  float local_64;
  ulong local_60;
  long local_58;
  ulong local_50;
  float local_48;
  float local_44;
  long local_40;
  float local_34;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  
  local_114 = layer->filter_size;
  iVar9 = iimage->height;
  iVar18 = (int)(local_114 - 1) / 2;
  uStack_140 = 3;
  local_120 = (long)(int)local_114 / 3 & 0xffffffff;
  local_50 = local_120;
  local_c0 = (ulong)local_114;
  if ((int)local_114 <= iVar9) {
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer,iimage);
    return;
  }
  uVar1 = iimage->width;
  iVar17 = (int)((long)(int)local_114 / 3);
  if (iVar9 <= iVar18) {
    iVar10 = layer->height;
    iVar16 = layer->step;
    local_78 = (long)iVar16;
    iVar8 = iimage->data_width;
    pfVar2 = iimage->data;
    local_c8 = CONCAT44(local_c8._4_4_,iVar10);
    local_48 = 1.0 / (float)(int)(local_114 * local_114);
    local_108 = layer->response;
    local_100 = layer->laplacian;
    local_110 = iimage;
    if (iVar17 < (int)uVar1) {
      local_d8 = (undefined1 *)&local_138;
      lVar4 = -((ulong)uVar1 * 4 + 0xf & 0xfffffffffffffff0);
      local_40 = (long)&local_138 + lVar4;
      iVar15 = layer->width * iVar16;
      iVar8 = (iVar9 + -1) * iVar8;
      iVar9 = iVar8 - iVar17;
      iVar13 = iVar17 + -1 + iVar8;
      for (lVar11 = 0; lVar11 < iVar15 - iVar17; lVar11 = lVar11 + local_78) {
        lVar14 = (long)iVar13;
        iVar9 = iVar9 + iVar16;
        iVar13 = iVar13 + iVar16;
        *(float *)(local_40 + lVar11 * 4) = pfVar2[lVar14];
      }
      fVar20 = pfVar2[(int)((uVar1 - 1) + iVar8)];
      for (; lVar11 < iVar17; lVar11 = lVar11 + local_78) {
        *(float *)(local_40 + lVar11 * 4) = fVar20;
        iVar9 = iVar9 + iVar16;
      }
      local_70 = (long)iVar15;
      for (; lVar11 < iVar15; lVar11 = lVar11 + local_78) {
        lVar14 = (long)iVar9;
        iVar9 = iVar9 + iVar16;
        *(float *)(local_40 + lVar11 * 4) = fVar20 - pfVar2[lVar14];
      }
      local_c8 = CONCAT44(local_c8._4_4_,iVar10 * iVar16);
      *(undefined8 *)((long)&uStack_140 + lVar4) = 6;
      uVar12 = (ulong)(uint)-iVar18;
      iVar9 = (int)local_50;
      local_a0 = (bool *)CONCAT44(local_a0._4_4_,iVar9 * 2 + -1);
      iVar18 = (int)((long)((ulong)(uint)((int)local_c0 >> 0x1f) << 0x20 | local_c0 & 0xffffffff) /
                    (long)(int)*(undefined8 *)((long)&uStack_140 + lVar4));
      local_e0 = (float *)CONCAT44(local_e0._4_4_,iVar18);
      local_98 = (float *)(ulong)(uint)-iVar18;
      *(undefined8 *)((long)&uStack_140 + lVar4) = 1;
      uVar7 = local_50;
      piVar5 = local_110;
      local_90 = (float *)(ulong)(uint)((int)*(undefined8 *)((long)&uStack_140 + lVar4) - iVar9);
      local_e8 = 0;
      local_88 = (ulong)(uint)-iVar9;
      local_80 = 0;
      local_f0 = uVar12;
      while( true ) {
        iVar9 = (int)local_80;
        if ((int)local_c8 <= iVar9) break;
        local_34 = (float)(iVar9 - (int)local_e0);
        local_e8 = (long)(int)local_e8;
        local_d0 = (ulong)(uint)(iVar9 - (int)local_50);
        local_44 = (float)((iVar9 - (int)local_50) + 1);
        local_a8 = (bool *)CONCAT44(local_a8._4_4_,iVar9 + 1);
        for (lVar11 = 0; fVar20 = local_34, lVar11 < local_70; lVar11 = lVar11 + local_78) {
          iVar10 = (int)uVar7;
          iVar17 = (int)local_a0;
          iVar9 = (int)local_90;
          iVar18 = (int)lVar11;
          local_b8._0_4_ = (float)*(uint *)(local_40 + lVar11 * 4);
          *(undefined8 *)((long)&uStack_140 + lVar4) = 0x10e4d0;
          auVar24._0_4_ =
               box_integral_unconditional(piVar5,(int)fVar20,iVar9 + iVar18,iVar10,iVar17);
          fVar20 = local_44;
          uVar6 = local_c0;
          auVar24._4_60_ = extraout_var_02;
          auVar3 = vfmadd213ss_fma(auVar24._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                   ZEXT416((uint)(float)local_b8));
          local_b8 = CONCAT44(local_b8._4_4_,auVar3._0_4_);
          *(undefined8 *)((long)&uStack_140 + lVar4) = 0x10e50a;
          fVar19 = box_integral_unconditional
                             (piVar5,(int)fVar20,(int)uVar12 + iVar18,iVar17,(int)uVar6);
          iVar9 = (int)local_98;
          local_b0._0_4_ = fVar19;
          *(undefined8 *)((long)&uStack_140 + lVar4) = 0x10e52e;
          auVar25._0_4_ =
               box_integral_unconditional(piVar5,(int)fVar20,iVar9 + iVar18,iVar17,iVar10);
          uVar12 = local_d0;
          auVar25._4_60_ = extraout_var_03;
          auVar3 = vfmadd132ss_fma(auVar25._0_16_,ZEXT416((uint)(float)local_b0),ZEXT416(0xc0400000)
                                  );
          local_b0 = CONCAT44(local_b0._4_4_,auVar3._0_4_);
          local_60 = CONCAT44(local_60._4_4_,iVar18 + 1);
          *(undefined8 *)((long)&uStack_140 + lVar4) = 0x10e563;
          fVar20 = box_integral_unconditional(piVar5,(int)uVar12,iVar18 + 1,iVar10,iVar10);
          iVar9 = (int)local_a8;
          iVar18 = (int)local_88 + iVar18;
          local_58._0_4_ = fVar20;
          *(undefined8 *)((long)&uStack_140 + lVar4) = 0x10e58b;
          fVar20 = box_integral_unconditional(piVar5,iVar9,iVar18,iVar10,iVar10);
          uVar12 = local_d0;
          local_58._0_4_ = fVar20 + (float)local_58;
          *(undefined8 *)((long)&uStack_140 + lVar4) = 0x10e5ad;
          fVar20 = box_integral_unconditional(piVar5,(int)uVar12,iVar18,iVar10,iVar10);
          uVar12 = local_f0;
          local_58 = CONCAT44(local_58._4_4_,(float)local_58 - fVar20);
          iVar18 = (int)local_60;
          *(undefined8 *)((long)&uStack_140 + lVar4) = 0x10e5d6;
          fVar20 = box_integral_unconditional(piVar5,iVar9,iVar18,iVar10,iVar10);
          fVar20 = local_48 * ((float)local_58 - fVar20);
          auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar20 * -0.81)),
                                   ZEXT416((uint)(local_48 * (float)local_b0)),
                                   ZEXT416((uint)(local_48 * (float)local_b8)));
          local_108[local_e8] = auVar3._0_4_;
          local_100[local_e8] = 0.0 <= local_48 * (float)local_b8 + local_48 * (float)local_b0;
          local_e8 = local_e8 + 1;
        }
        local_80 = (ulong)(uint)((int)local_80 + (int)local_78);
      }
    }
    else {
      iVar16 = layer->width * iVar16;
      local_f4 = uVar1 - 1;
      local_64 = pfVar2[(int)((iVar9 + -1) * iVar8 + -1 + uVar1)];
      uVar12 = (ulong)(uint)-iVar18;
      local_114 = (int)local_114 / 6;
      local_130 = (ulong)~local_114;
      local_138 = (long)(int)(iVar16 - local_114);
      local_128 = (ulong)(~local_114 + iVar17);
      local_e8 = CONCAT44(local_e8._4_4_,iVar17 * 2 + -1);
      local_b8 = (ulong)-local_114;
      iVar9 = 0;
      local_b0 = (ulong)(uint)-iVar17;
      local_d0 = CONCAT44(local_d0._4_4_,iVar16);
      local_d8 = (undefined1 *)CONCAT44(local_d8._4_4_,iVar8);
      local_f0 = uVar12;
      local_e0 = pfVar2;
      for (local_88 = 0; uVar7 = local_50, (long)local_88 < local_138;
          local_88 = local_88 + local_78) {
        iVar10 = 0;
        iVar18 = (int)local_88;
        auVar3 = vfmadd132ss_fma(ZEXT416((uint)local_e0[((int)local_128 + iVar18) * iVar8 + local_f4
                                                       ]),ZEXT416((uint)local_64),
                                 ZEXT416(0xc0400000));
        local_44 = auVar3._0_4_ * local_48;
        local_60 = (ulong)(uint)(iVar18 - (int)local_120);
        local_80 = CONCAT44(local_80._4_4_,iVar9);
        local_a0 = (bool *)CONCAT44(local_a0._4_4_,(iVar18 - (int)local_120) + 1);
        local_98 = (float *)CONCAT44(local_98._4_4_,iVar18 + 1);
        local_58 = 0;
        local_90 = local_108 + iVar9;
        local_a8 = local_100 + iVar9;
        for (; piVar5 = local_110, iVar10 < iVar16; iVar10 = (int)local_78 + iVar10) {
          iVar18 = (int)local_a0;
          iVar9 = (int)local_e8;
          uStack_140 = 0x10de2f;
          fVar20 = box_integral_unconditional
                             (local_110,(int)local_a0,(int)uVar12 + iVar10,(int)local_e8,
                              (int)local_c0);
          uStack_140 = 0x10de4f;
          local_40._0_4_ = fVar20;
          auVar21._0_4_ =
               box_integral_unconditional(piVar5,iVar18,(int)local_b8 + iVar10,iVar9,iVar17);
          auVar21._4_60_ = extraout_var;
          auVar3 = vfmadd132ss_fma(auVar21._0_16_,ZEXT416((uint)(float)local_40),ZEXT416(0xc0400000)
                                  );
          local_40 = CONCAT44(local_40._4_4_,auVar3._0_4_);
          local_70 = CONCAT44(local_70._4_4_,iVar10 + 1);
          uStack_140 = 0x10de7a;
          local_34 = box_integral_unconditional(piVar5,(int)local_60,iVar10 + 1,iVar17,iVar17);
          iVar9 = (int)local_98;
          iVar18 = (int)local_b0 + iVar10;
          uStack_140 = 0x10dea5;
          fVar20 = box_integral_unconditional(piVar5,(int)local_98,iVar18,iVar17,iVar17);
          local_34 = fVar20 + local_34;
          uStack_140 = 0x10dec4;
          fVar20 = box_integral_unconditional(piVar5,(int)local_60,iVar18,iVar17,iVar17);
          uVar12 = local_f0;
          local_34 = local_34 - fVar20;
          uStack_140 = 0x10deed;
          fVar20 = box_integral_unconditional(piVar5,iVar9,(int)local_70,iVar17,iVar17);
          fVar20 = local_48 * (local_34 - fVar20);
          auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar20 * -0.81)),
                                   ZEXT416((uint)(local_48 * (float)local_40)),
                                   ZEXT416((uint)local_44));
          local_90[local_58] = auVar3._0_4_;
          local_a8[local_58] = 0.0 <= local_44 + local_48 * (float)local_40;
          local_58 = local_58 + 1;
          iVar16 = (int)local_d0;
        }
        iVar9 = (int)local_80 + (int)local_58;
        iVar8 = (int)local_d8;
      }
      local_64 = local_64 * -2.0;
      local_90 = (float *)CONCAT44(local_90._4_4_,local_64 * local_48);
      while( true ) {
        iVar17 = (int)local_88;
        iVar18 = (int)local_50;
        if ((int)local_114 < iVar17) break;
        local_60 = (ulong)(uint)(iVar17 - (int)local_50);
        local_44 = (float)((iVar17 - (int)local_50) + 1);
        local_a8 = (bool *)CONCAT44(local_a8._4_4_,iVar17 + 1);
        local_80 = CONCAT44(local_80._4_4_,iVar9);
        local_98 = local_108 + iVar9;
        local_a0 = local_100 + iVar9;
        local_58 = 0;
        for (iVar9 = 0; fVar20 = local_44, piVar5 = local_110, iVar9 < iVar16;
            iVar9 = (int)local_78 + iVar9) {
          iVar18 = (int)local_e8;
          uStack_140 = 0x10e04e;
          fVar19 = box_integral_unconditional
                             (local_110,(int)local_44,(int)uVar12 + iVar9,(int)local_e8,
                              (int)local_c0);
          iVar17 = (int)uVar7;
          uStack_140 = 0x10e06e;
          local_40._0_4_ = fVar19;
          auVar22._0_4_ =
               box_integral_unconditional(piVar5,(int)fVar20,(int)local_b8 + iVar9,iVar18,iVar17);
          auVar22._4_60_ = extraout_var_00;
          auVar3 = vfmadd132ss_fma(auVar22._0_16_,ZEXT416((uint)(float)local_40),ZEXT416(0xc0400000)
                                  );
          local_40 = CONCAT44(local_40._4_4_,auVar3._0_4_);
          local_70 = CONCAT44(local_70._4_4_,iVar9 + 1);
          uStack_140 = 0x10e099;
          local_34 = box_integral_unconditional(piVar5,(int)local_60,iVar9 + 1,iVar17,iVar17);
          iVar18 = (int)local_a8;
          iVar10 = (int)local_b0 + iVar9;
          uStack_140 = 0x10e0c4;
          fVar20 = box_integral_unconditional(piVar5,(int)local_a8,iVar10,iVar17,iVar17);
          local_34 = fVar20 + local_34;
          uStack_140 = 0x10e0e3;
          fVar20 = box_integral_unconditional(piVar5,(int)local_60,iVar10,iVar17,iVar17);
          uVar12 = local_f0;
          local_34 = local_34 - fVar20;
          uStack_140 = 0x10e10c;
          fVar20 = box_integral_unconditional(piVar5,iVar18,(int)local_70,iVar17,iVar17);
          fVar20 = local_48 * (local_34 - fVar20);
          auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar20 * -0.81)),
                                   ZEXT416((uint)(local_48 * (float)local_40)),
                                   ZEXT416((uint)local_90._0_4_));
          local_98[local_58] = auVar3._0_4_;
          local_a0[local_58] = 0.0 <= local_90._0_4_ + local_48 * (float)local_40;
          local_58 = local_58 + 1;
          iVar16 = (int)local_d0;
        }
        iVar9 = (int)local_80 + (int)local_58;
        local_88 = local_88 + local_78;
        iVar8 = (int)local_d8;
      }
      local_c8 = (long)((int)local_c8 * (int)local_78);
      for (; (long)local_88 < local_c8; local_88 = local_88 + local_78) {
        iVar10 = 0;
        iVar17 = (int)local_88;
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_e0[((int)local_130 + iVar17) * iVar8 + local_f4
                                                       ]),SUB6416(ZEXT464(0x40400000),0),
                                 ZEXT416((uint)local_64));
        local_44 = auVar3._0_4_ * local_48;
        local_60 = (ulong)(uint)(iVar17 - (int)local_120);
        local_80 = CONCAT44(local_80._4_4_,iVar9);
        local_a0 = (bool *)CONCAT44(local_a0._4_4_,(iVar17 - (int)local_120) + 1);
        local_98 = (float *)CONCAT44(local_98._4_4_,iVar17 + 1);
        local_58 = 0;
        local_90 = local_108 + iVar9;
        local_a8 = local_100 + iVar9;
        for (; piVar5 = local_110, iVar10 < iVar16; iVar10 = (int)local_78 + iVar10) {
          iVar17 = (int)local_a0;
          iVar9 = (int)local_e8;
          uStack_140 = 0x10e2a2;
          fVar20 = box_integral_unconditional
                             (local_110,(int)local_a0,(int)uVar12 + iVar10,(int)local_e8,
                              (int)local_c0);
          uStack_140 = 0x10e2c2;
          local_40._0_4_ = fVar20;
          auVar23._0_4_ =
               box_integral_unconditional(piVar5,iVar17,(int)local_b8 + iVar10,iVar9,iVar18);
          auVar23._4_60_ = extraout_var_01;
          auVar3 = vfmadd132ss_fma(auVar23._0_16_,ZEXT416((uint)(float)local_40),ZEXT416(0xc0400000)
                                  );
          local_40 = CONCAT44(local_40._4_4_,auVar3._0_4_);
          local_70 = CONCAT44(local_70._4_4_,iVar10 + 1);
          uStack_140 = 0x10e2ed;
          local_34 = box_integral_unconditional(piVar5,(int)local_60,iVar10 + 1,iVar18,iVar18);
          iVar9 = (int)local_98;
          iVar17 = (int)local_b0 + iVar10;
          uStack_140 = 0x10e318;
          fVar20 = box_integral_unconditional(piVar5,(int)local_98,iVar17,iVar18,iVar18);
          local_34 = fVar20 + local_34;
          uStack_140 = 0x10e337;
          fVar20 = box_integral_unconditional(piVar5,(int)local_60,iVar17,iVar18,iVar18);
          uVar12 = local_f0;
          local_34 = local_34 - fVar20;
          uStack_140 = 0x10e360;
          fVar20 = box_integral_unconditional(piVar5,iVar9,(int)local_70,iVar18,iVar18);
          fVar20 = local_48 * (local_34 - fVar20);
          auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar20 * -0.81)),
                                   ZEXT416((uint)(local_48 * (float)local_40)),
                                   ZEXT416((uint)local_44));
          local_90[local_58] = auVar3._0_4_;
          local_a8[local_58] = 0.0 <= local_44 + local_48 * (float)local_40;
          local_58 = local_58 + 1;
          iVar16 = (int)local_d0;
        }
        iVar9 = (int)local_80 + (int)local_58;
        iVar8 = (int)local_d8;
      }
    }
    return;
  }
  if (SBORROW4(uVar1,iVar17 * 2) == (int)(uVar1 + iVar17 * -2) < 0) {
    height_greater_border_width_greater_double_lobe_Dyy_inlined(layer,iimage);
    return;
  }
  height_greater_border_width_less_double_lobe_Dyy_inlined(layer,iimage);
  return;
}

Assistant:

void compute_response_layer_switch_Dyy_unconditional(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function:
        - compute_response_layer_switch_Dyy
        (- compute_response_layer_unconditional)

        optimization:
        - box_integral_unconditional instead of box_integral
            => makes use of padded image and removes all conditionals
        - uses compute_response_layer_Dyy_laplacian_locality_uncond_opt_flops_inlined
            => best function for filter_size <= iheight
    */

    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j;
    int x = 0;
    int y = 0;

    // 1. Case The filter is smaller than the image
    if (filter_size <= iheight) {
        // Split the image into 9 cases - corners, borders and middle part.
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

    } else {
        // 2. Case The filter is somewhat larger than the image
        if (iheight > border) {

            // 2.1. D is sometimes outside the image. Blue lines edition brings the switch into Dyy
            // Idea: Do compute_response_layer_Dyy_leftcorner
            // but everytime all corners are outside, we just use row values above
            if (iwidth > 2 * lobe - 1) {
                height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);
            } else {
                height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);
            }

        } else {
            // Case 2.2 D is always outside the image.
            // Half the filter height is longer than the image.
            if (iwidth <= lobe) {
                // Case 2.2a the filter is longer and wider than the image.

                // D is right bottom corner or to the right (possibly below image)
                // A, B, C = 0
                D0 = data[(iheight-1) * data_width + (iwidth-1)];

                // Differentiate 2 cases
                // for the negative part:
                // 1.
                // is negative / inner part of Dyy box filter completely too big
                // i.e. is inner D on the right bottom corner or even bigger (to the right or below)
                // SADLY THIS CASE NEVER HAPPENS. CRY :(

                // if (iheight <= lobe/2-1) {
                // D1 = D0;
                //
                // // combine Dyy
                // Dyy = D0 - 3 * D1;
                // Dyy *= inv_area;
                //
                // for (i = 0; i < height * step; i += step) {
                //
                //     for (j = 0; j < width * step; j += step) {
                //         // Image coordinates
                //         x = i;
                //         y = j;
                //
                //         // Calculate Dxx, Dyy, Dxy with Box Filter
                //         Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                //                 - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                //         Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                //                 + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);
                //
                //         // Normalize Responses with inverse area
                //         Dyy *= inv_area;
                //         Dxy *= inv_area;
                //
                //         // Calculate Determinant
                //         response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;
                //
                //         // Calculate Laplacian
                //         laplacian[ind] = Dxx + Dyy >= 0;
                //         ind += 1;
                //     }
                // }

                // 2. Case
                // Only for - image_size: 32, filter_size: 99
                // inner D is in last col but the inner part is not too big
                // col is irrelevant, B and D have always the same value
                // i.e. inner loop is irrelevant for coords and values

                // We divide it again in 3 parts.
                // 1. B outside, D inside
                // 2. B outside, D outside
                // 3. B inside, D outside

                // 1. Case: B outside, D inside
                for (x = 0; x < width*step-lobe/2; x += step) {
                    // negative part
                    r10 = x - lobe / 2 - 1;
                    r11 = r10 + lobe;  // TODO: fix this

                    D1 = data[r11 * data_width + (iwidth-1)];

                    // Compute Dyy
                    Dyy = D0 - 3 * D1;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 2. Case: B outside, D outside
                Dyy = - 2 * D0;
                Dyy *= inv_area;

                for (; x < lobe/2+1; x += step) {

                    for (y = 0; y < width*step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 3. Case: B inside, D outside
                for (; x < height * step; x += step) {
                    r10 = x - lobe / 2 - 1;

                    B = data[r10 * data_width + (iwidth-1)];
                    // D1 = D0 - B;
                    // Dyy = D0 - 3 * D1;
                    // Dyy *= inv_area;

                    // this can be simplified to:
                    // (small difference in original is this but error is <0.000001 eps)
                    Dyy = 3*B - 2*D0;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

            } else {
                /* 2.2.b Half the filter is longer than the image, but narrower.
                // HERE: width > lobe and height <= border
                // Here only the whole filter is optimized, not negative part

                // Only happens for filter: 75 and image: 32

                // A, B = 0
                // D is outside (i.e. below) the image, but the columns change.
                // => D = [height-1, some_column]
                // C = 0 or [height-1, some_column]
                */

                // Create array for Dyy that has image width length
                // all rows (for big part) have same Dyy values
                float Dyy_arr[iwidth];  // stack is faster than heap

                // C = 0 and D = [height-1, some_column]
                // from y = 0 until D is (exclusive) in last column
                for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
                    // C = 0
                    // D = [height-1, i+lobe-1]
                    D = data[(iheight-1) * data_width + (i+lobe-1)];
                    Dyy_arr[i] = D;
                }

                // only bottom left corner value needed
                D = data[(iheight-1) * data_width + (iwidth-1)];

                // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
                // C is still outside and D now too
                for (; i < lobe; i += step) {  // 7 - 25
                    Dyy_arr[i] = D;
                }

                // if y = lobe, then C = [height-1, 0]
                // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
                for (; i < width*step; i += step) {  // 25 - 32
                    // C = [height-1, i-lobe]
                    // D = [height-1, width-1]
                    C = data[(iheight-1) * data_width + (i-lobe)];
                    Dyy_arr[i] = D - C;
                }

                // Use precomputation for faster compute
                for (x = 0; x < height * step; x += step) {

                    for (y = 0; y < width * step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dyy = Dyy_arr[y] - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dyy *= inv_area;
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;

                        // Increment index
                        ind += 1;
                    }
                }
            }
        }
    }
}